

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  Allocator *pAVar5;
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 extraout_var [12];
  Mat anchors;
  Mat local_b8;
  void *local_68;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar6 = ParamDict::get(pd,0,0x10);
  this->feat_stride = iVar6;
  iVar6 = ParamDict::get(pd,1,0x10);
  this->base_size = iVar6;
  iVar6 = ParamDict::get(pd,2,6000);
  this->pre_nms_topN = iVar6;
  iVar6 = ParamDict::get(pd,3,300);
  this->after_nms_topN = iVar6;
  fVar12 = ParamDict::get(pd,4,0.7);
  this->nms_thresh = fVar12;
  iVar6 = ParamDict::get(pd,5,0x10);
  this->min_size = iVar6;
  iVar6 = this->base_size;
  uVar1 = (this->ratios).w;
  uVar2 = (this->scales).w;
  local_b8.cstep = 0;
  local_b8.data = (float *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Mat::create(&local_b8,4,uVar2 * uVar1,4,(Allocator *)0x0);
  if (0 < (int)uVar1) {
    local_58 = (float)iVar6 * 0.5;
    local_68 = (this->ratios).data;
    pvVar3 = (this->scales).data;
    lVar10 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    local_60 = lVar10 * (ulong)uVar2;
    uVar11 = 0;
    pfVar9 = (float *)local_b8.data;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      if (0 < (int)uVar2) {
        fVar12 = *(float *)((long)local_68 + uVar11 * 4);
        auVar15 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar12));
        fVar13 = auVar15._0_4_;
        fVar13 = roundf(fVar13 * -0.5 * (float)iVar6 * (fVar12 * fVar13 * fVar13 + -3.0));
        local_48 = (float)(int)fVar13;
        fStack_44 = (float)(int)extraout_var._0_4_;
        fStack_40 = (float)(int)extraout_var._4_4_;
        fStack_3c = (float)(int)extraout_var._8_4_;
        fVar12 = roundf(fVar12 * local_48);
        uVar8 = 0;
        pfVar7 = pfVar9;
        do {
          fVar13 = *(float *)((long)pvVar3 + uVar8 * 4) * 0.5;
          fVar14 = fVar13 * local_48;
          fVar13 = fVar13 * (float)(int)fVar12;
          *pfVar7 = local_58 - fVar14;
          pfVar7[1] = fStack_54 - fVar13;
          pfVar7[2] = fVar14 + fStack_50;
          pfVar7[3] = fVar13 + fStack_4c;
          uVar8 = uVar8 + 1;
          pfVar7 = (float *)((long)pfVar7 + lVar10);
        } while (uVar2 != uVar8);
      }
      uVar11 = uVar11 + 1;
      pfVar9 = (float *)((long)pfVar9 + local_60);
    } while (uVar11 != uVar1);
  }
  if (&this->anchors != &local_b8) {
    piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->anchors).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar3 = (this->anchors).data;
        pAVar5 = (this->anchors).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->anchors).cstep = 0;
    *(undefined8 *)((long)&(this->anchors).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->anchors).elemsize + 4) = 0;
    (this->anchors).data = (void *)0x0;
    (this->anchors).refcount = (int *)0x0;
    (this->anchors).dims = 0;
    (this->anchors).w = 0;
    (this->anchors).h = 0;
    (this->anchors).d = 0;
    (this->anchors).c = 0;
    (this->anchors).data = local_b8.data;
    (this->anchors).refcount = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->anchors).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->anchors).elempack = local_b8.elempack;
    (this->anchors).allocator = local_b8.allocator;
    (this->anchors).dims = local_b8.dims;
    (this->anchors).w = local_b8.w;
    (this->anchors).h = local_b8.h;
    (this->anchors).d = local_b8.d;
    (this->anchors).c = local_b8.c;
    (this->anchors).cstep = local_b8.cstep;
  }
  piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((float *)local_b8.data != (float *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}